

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O3

void __thiscall
AssignmentStatement::AssignmentStatement
          (AssignmentStatement *this,string *lhsVar,Testlist *testlist)

{
  pointer pcVar1;
  
  (this->super_Function).super_Statement.indentState = 0;
  (this->super_Function).super_Statement.isFunction = false;
  (this->super_Function).super_Statement._statements.
  super__Vector_base<Statement_*,_std::allocator<Statement_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_Function).super_Statement._statements.
  super__Vector_base<Statement_*,_std::allocator<Statement_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_Function).super_Statement._statements.
  super__Vector_base<Statement_*,_std::allocator<Statement_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_Function).super_Statement._id._M_dataplus._M_p =
       (pointer)&(this->super_Function).super_Statement._id.field_2;
  (this->super_Function).super_Statement._id._M_string_length = 0;
  (this->super_Function).super_Statement._id.field_2._M_local_buf[0] = '\0';
  (this->super_Function)._id._M_dataplus._M_p = (pointer)&(this->super_Function)._id.field_2;
  (this->super_Function)._id._M_string_length = 0;
  (this->super_Function)._id.field_2._M_local_buf[0] = '\0';
  (this->super_Function)._paramenters.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Function)._paramenters.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Function)._paramenters.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Function)._statements = (Statements *)0x0;
  (this->super_Functions)._functionStack.super__Vector_base<Function_*,_std::allocator<Function_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Functions)._functionStack.super__Vector_base<Function_*,_std::allocator<Function_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Functions)._functionStack.super__Vector_base<Function_*,_std::allocator<Function_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Function).super_Statement._vptr_Statement = (_func_int **)&PTR_print_0011db88;
  (this->_lhsVariable)._M_dataplus._M_p = (pointer)&(this->_lhsVariable).field_2;
  pcVar1 = (lhsVar->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_lhsVariable,pcVar1,pcVar1 + lhsVar->_M_string_length);
  this->_rhsExpression = (ExprNode *)0x0;
  this->_testlist = testlist;
  this->_subscription = (ExprNode *)0x0;
  (this->_functionStack).super__Vector_base<Statement_*,_std::allocator<Statement_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_functionStack).super__Vector_base<Statement_*,_std::allocator<Statement_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_functionStack).super__Vector_base<Statement_*,_std::allocator<Statement_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

AssignmentStatement::AssignmentStatement(std::string lhsVar, Testlist *testlist):
    _lhsVariable{lhsVar}, _rhsExpression{nullptr}, _testlist{testlist},  _subscription{nullptr} {}